

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O1

void __thiscall
TPZEqnArray<std::complex<long_double>_>::Reset(TPZEqnArray<std::complex<long_double>_> *this)

{
  TPZManVector<int,_100>::Resize(&(this->fEqStart).super_TPZManVector<int,_100>,0);
  (*(this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>._vptr_TPZVec[3])
            (&this->fEqStart);
  (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore
  [(this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements + -1] = 0;
  TPZManVector<std::complex<long_double>,_1000>::Resize
            (&(this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>,0);
  TPZManVector<int,_1000>::Resize(&(this->fIndex).super_TPZManVector<int,_1000>,0);
  this->fLastTerm = 0;
  this->fSymmetric = EIsUndefined;
  this->fNumEq = 0;
  return;
}

Assistant:

void TPZEqnArray<TVar>::Reset(){
	fEqStart.Resize(0);
	fEqStart.Push(0);
	fEqValues.Resize(0);
	fIndex.Resize(0);
	fNumEq=0;
	fLastTerm=0;
	fSymmetric=EIsUndefined;
	
}